

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to8.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_pack1to8_avx
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  long lVar7;
  uint _w;
  ulong uVar8;
  undefined4 *puVar9;
  void *pvVar10;
  ulong uVar11;
  int k;
  ulong uVar12;
  ulong uVar13;
  int p;
  ulong uVar14;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  uVar11 = 0;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  Mat::create(kernel_tm,_w * 8,inch,outch / 8,4,(Allocator *)0x0);
  sVar1 = kernel_tm->cstep;
  sVar2 = kernel_tm->elemsize;
  uVar8 = (ulong)_w;
  if ((int)_w < 1) {
    uVar8 = uVar11;
  }
  pvVar3 = kernel_tm->data;
  uVar13 = (ulong)(uint)inch;
  if (inch < 1) {
    uVar13 = uVar11;
  }
  lVar7 = local_78.elemsize * local_78.cstep;
  pvVar6 = local_78.data;
  for (; (long)(uVar11 | 7) < (long)outch; uVar11 = uVar11 + 8) {
    puVar9 = (undefined4 *)((uVar11 >> 3) * sVar1 * sVar2 + (long)pvVar3);
    pvVar10 = pvVar6;
    for (uVar14 = 0; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
        *puVar9 = *(undefined4 *)((long)pvVar10 + uVar12 * 4);
        lVar4 = lVar7 + uVar12 * 4;
        puVar9[1] = *(undefined4 *)((long)pvVar10 + lVar7 + uVar12 * 4);
        lVar5 = lVar7 + lVar4;
        puVar9[2] = *(undefined4 *)((long)pvVar10 + lVar7 + lVar4);
        lVar4 = lVar7 + lVar5;
        puVar9[3] = *(undefined4 *)((long)pvVar10 + lVar7 + lVar5);
        lVar5 = lVar7 + lVar4;
        puVar9[4] = *(undefined4 *)((long)pvVar10 + lVar7 + lVar4);
        lVar4 = lVar7 + lVar5;
        puVar9[5] = *(undefined4 *)((long)pvVar10 + lVar7 + lVar5);
        puVar9[6] = *(undefined4 *)((long)pvVar10 + lVar7 + lVar4);
        puVar9[7] = *(undefined4 *)((long)pvVar10 + lVar7 * 2 + lVar4);
        puVar9 = puVar9 + 8;
      }
      pvVar10 = (void *)((long)pvVar10 + (long)local_78.w * local_78.elemsize);
    }
    pvVar6 = (void *)((long)pvVar6 + lVar7 * 8);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack1to8_avx(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8b-4a-maxk-inch/4a-outch/8b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(8 * maxk, inch, outch / 8);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);
        const Mat k4 = kernel.channel(q + 4);
        const Mat k5 = kernel.channel(q + 5);
        const Mat k6 = kernel.channel(q + 6);
        const Mat k7 = kernel.channel(q + 7);

        float* g00 = kernel_tm.channel(q / 8);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);
            const float* k10 = k1.row(p);
            const float* k20 = k2.row(p);
            const float* k30 = k3.row(p);
            const float* k40 = k4.row(p);
            const float* k50 = k5.row(p);
            const float* k60 = k6.row(p);
            const float* k70 = k7.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];
                g00[4] = k40[k];
                g00[5] = k50[k];
                g00[6] = k60[k];
                g00[7] = k70[k];

                g00 += 8;
            }
        }
    }
}